

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DisplayResource.cpp
# Opt level: O0

bool __thiscall DisplayResource::load(DisplayResource *this)

{
  undefined4 uVar1;
  undefined8 uVar2;
  char *pcVar3;
  undefined8 uVar4;
  long in_RDI;
  bool bVar5;
  ALLEGRO_BITMAP *bmp;
  int flags;
  
  uVar1 = 1;
  if (useFullScreenMode) {
    uVar1 = 2;
  }
  al_set_new_display_flags(uVar1);
  uVar2 = al_create_display(BB_W,BB_H);
  *(undefined8 *)(in_RDI + 8) = uVar2;
  bVar5 = *(long *)(in_RDI + 8) != 0;
  if (bVar5) {
    pcVar3 = getResource("gfx/icon48.png");
    uVar2 = al_load_bitmap(pcVar3);
    al_set_display_icon(*(undefined8 *)(in_RDI + 8),uVar2);
    al_destroy_bitmap(uVar2);
    BB_W = al_get_display_width(*(undefined8 *)(in_RDI + 8));
    BB_H = al_get_display_height(*(undefined8 *)(in_RDI + 8));
    uVar2 = al_create_event_queue();
    *(undefined8 *)(in_RDI + 0x10) = uVar2;
    uVar2 = *(undefined8 *)(in_RDI + 0x10);
    uVar4 = al_get_display_event_source(*(undefined8 *)(in_RDI + 8));
    al_register_event_source(uVar2,uVar4);
  }
  return bVar5;
}

Assistant:

bool DisplayResource::load(void)
{
#ifdef ALLEGRO_IPHONE
   int flags = ALLEGRO_FULLSCREEN_WINDOW;
   al_set_new_display_option(ALLEGRO_SUPPORTED_ORIENTATIONS, ALLEGRO_DISPLAY_ORIENTATION_LANDSCAPE, ALLEGRO_REQUIRE);
#else
   int flags = useFullScreenMode ? ALLEGRO_FULLSCREEN : ALLEGRO_WINDOWED;
#endif
   al_set_new_display_flags(flags);
   display = al_create_display(BB_W, BB_H);
   if (!display)
       return false;

#ifndef ALLEGRO_IPHONE
   ALLEGRO_BITMAP *bmp = al_load_bitmap(getResource("gfx/icon48.png"));
   al_set_display_icon(display, bmp);
   al_destroy_bitmap(bmp);
#endif

   BB_W = al_get_display_width(display);
   BB_H = al_get_display_height(display);
   
#ifdef ALLEGRO_IPHONE
   if (BB_W < 960) {
	BB_W *= 2;
	BB_H *= 2;
	ALLEGRO_TRANSFORM t;
	al_identity_transform(&t);
	al_scale_transform(&t, 0.5, 0.5);
	al_use_transform(&t);
   }
#endif
      
   events = al_create_event_queue();
   al_register_event_source(events, al_get_display_event_source(display));

   return true;
}